

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int iVar3;
  uint uVar4;
  int extraout_EAX_00;
  undefined8 uVar5;
  ulong uVar6;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong unaff_RBX;
  undefined1 *puVar7;
  code *pcVar8;
  undefined8 *puVar9;
  code **ppcVar10;
  long *plVar11;
  undefined1 *in_R8;
  int64_t eval_b_1;
  int64_t eval_b_6;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client2;
  uv_udp_t client;
  long lStack_820;
  long lStack_818;
  undefined1 auStack_810 [16];
  undefined1 auStack_7fe [18];
  undefined8 uStack_7ec;
  undefined8 uStack_7e4;
  undefined8 uStack_7dc;
  undefined8 uStack_7d4;
  undefined8 uStack_7cc;
  undefined8 uStack_7c4;
  undefined8 uStack_7bc;
  undefined8 uStack_7b4;
  undefined8 uStack_7ac;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined8 uStack_798;
  undefined8 auStack_790 [23];
  long alStack_6d8 [41];
  ulong uStack_590;
  code *pcStack_588;
  long lStack_580;
  long lStack_578;
  undefined1 auStack_570 [16];
  sockaddr sStack_560;
  long alStack_550 [23];
  long alStack_498 [8];
  long lStack_458;
  code *pcStack_3e0;
  long lStack_3d0;
  long lStack_3c8;
  sockaddr sStack_3c0;
  long alStack_3b0 [23];
  code *pcStack_2f8;
  long lStack_2f0;
  long lStack_2e8;
  undefined1 auStack_2e0 [184];
  undefined1 *puStack_228;
  undefined8 *puStack_200;
  ulong uStack_1f8;
  code *pcStack_1f0;
  undefined8 uStack_1e0;
  code *apcStack_1d8 [2];
  undefined8 uStack_1c8;
  long lStack_1c0;
  undefined4 uStack_1b4;
  code *pcStack_1b0;
  long local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  long local_178 [23];
  long local_c0 [8];
  long local_80;
  
  pcStack_1b0 = (code *)0x1df179;
  local_198 = uv_buf_init("PING",4);
  pcStack_1b0 = (code *)0x1df199;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_188);
  local_c0[0] = (long)iVar1;
  local_178[0] = 0;
  if (local_c0[0] == 0) {
    pcStack_1b0 = (code *)0x1df1c4;
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_1b0 = (code *)0x1df1cb;
    uVar5 = uv_default_loop();
    pcStack_1b0 = (code *)0x1df1db;
    iVar1 = uv_udp_init(uVar5,local_c0);
    local_178[0] = (long)iVar1;
    local_1a8 = 0;
    if (local_178[0] != 0) goto LAB_001df428;
    pcStack_1b0 = (code *)0x1df208;
    iVar1 = uv_udp_open(local_c0,uVar2);
    local_178[0] = (long)iVar1;
    local_1a8 = 0;
    if (local_178[0] != 0) goto LAB_001df435;
    pcStack_1b0 = (code *)0x1df23a;
    iVar1 = uv_udp_bind(local_c0,local_188,0);
    local_178[0] = (long)iVar1;
    local_1a8 = 0;
    if (local_178[0] != 0) goto LAB_001df442;
    pcStack_1b0 = (code *)0x1df273;
    iVar1 = uv_udp_recv_start(local_c0,alloc_cb,recv_cb);
    local_178[0] = (long)iVar1;
    local_1a8 = 0;
    if (local_178[0] != 0) goto LAB_001df44f;
    in_R8 = local_188;
    in_RCX = (undefined4 *)0x1;
    pcStack_1b0 = (code *)0x1df2bb;
    iVar1 = uv_udp_send(&send_req,local_c0,local_198,1,in_R8,send_cb);
    local_178[0] = (long)iVar1;
    local_1a8 = 0;
    if (local_178[0] != 0) goto LAB_001df45c;
    pcStack_1b0 = (code *)0x1df2de;
    uVar5 = uv_default_loop();
    pcStack_1b0 = (code *)0x1df2eb;
    iVar1 = uv_udp_init(uVar5,local_178);
    local_1a8 = (long)iVar1;
    local_1a0 = 0;
    if (local_1a8 != 0) goto LAB_001df469;
    pcStack_1b0 = (code *)0x1df315;
    iVar1 = uv_udp_open(local_178,uVar2);
    local_1a8 = (long)iVar1;
    local_1a0 = -0x11;
    if (local_1a8 != -0x11) goto LAB_001df476;
    pcStack_1b0 = (code *)0x1df33f;
    uv_close(local_178,0);
    pcStack_1b0 = (code *)0x1df344;
    uVar5 = uv_default_loop();
    pcStack_1b0 = (code *)0x1df34e;
    uv_run(uVar5,0);
    local_1a8 = 1;
    local_1a0 = (long)send_cb_called;
    if (local_1a0 != 1) goto LAB_001df483;
    local_1a8 = 1;
    local_1a0 = (long)close_cb_called;
    if (local_1a0 != 1) goto LAB_001df490;
    local_1a8 = local_80;
    local_1a0 = 0;
    if (local_80 != 0) goto LAB_001df49d;
    pcStack_1b0 = (code *)0x1df3bd;
    unaff_RBX = uv_default_loop();
    pcStack_1b0 = (code *)0x1df3d1;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1b0 = (code *)0x1df3db;
    uv_run(unaff_RBX,0);
    local_1a8 = 0;
    pcStack_1b0 = (code *)0x1df3e8;
    uVar5 = uv_default_loop();
    pcStack_1b0 = (code *)0x1df3f0;
    iVar1 = uv_loop_close(uVar5);
    local_1a0 = (long)iVar1;
    if (local_1a8 == local_1a0) {
      pcStack_1b0 = (code *)0x1df40b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1b0 = (code *)0x1df428;
    run_test_udp_open_cold_1();
LAB_001df428:
    pcStack_1b0 = (code *)0x1df435;
    run_test_udp_open_cold_2();
LAB_001df435:
    pcStack_1b0 = (code *)0x1df442;
    run_test_udp_open_cold_3();
LAB_001df442:
    pcStack_1b0 = (code *)0x1df44f;
    run_test_udp_open_cold_4();
LAB_001df44f:
    pcStack_1b0 = (code *)0x1df45c;
    run_test_udp_open_cold_5();
LAB_001df45c:
    pcStack_1b0 = (code *)0x1df469;
    run_test_udp_open_cold_6();
LAB_001df469:
    pcStack_1b0 = (code *)0x1df476;
    run_test_udp_open_cold_7();
LAB_001df476:
    pcStack_1b0 = (code *)0x1df483;
    run_test_udp_open_cold_8();
LAB_001df483:
    pcStack_1b0 = (code *)0x1df490;
    run_test_udp_open_cold_9();
LAB_001df490:
    pcStack_1b0 = (code *)0x1df49d;
    run_test_udp_open_cold_10();
LAB_001df49d:
    pcStack_1b0 = (code *)0x1df4aa;
    run_test_udp_open_cold_11();
  }
  pcStack_1b0 = create_udp_socket;
  run_test_udp_open_cold_12();
  apcStack_1d8[0] = (code *)0x1df4cd;
  pcStack_1b0 = (code *)unaff_RBX;
  uVar2 = socket(2,2,0);
  puVar7 = (undefined1 *)(ulong)uVar2;
  lStack_1c0 = (long)(int)uVar2;
  uStack_1c8 = 0;
  if (lStack_1c0 < 0) {
    apcStack_1d8[0] = (code *)0x1df540;
    create_udp_socket_cold_2();
  }
  else {
    in_RCX = &uStack_1b4;
    uStack_1b4 = 1;
    in_R8 = (undefined1 *)0x4;
    apcStack_1d8[0] = (code *)0x1df50d;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    lStack_1c0 = (long)iVar1;
    uStack_1c8 = 0;
    if (lStack_1c0 == 0) {
      return uVar2;
    }
  }
  pcVar8 = (code *)&uStack_1c8;
  ppcVar10 = apcStack_1d8;
  apcStack_1d8[0] = alloc_cb;
  create_udp_socket_cold_1();
  uStack_1e0 = 0x10000;
  if ((long)pcVar8 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0xfed960;
  }
  puVar9 = &uStack_1e0;
  pcStack_1f0 = recv_cb;
  apcStack_1d8[0] = pcVar8;
  alloc_cb_cold_1();
  iVar1 = (int)&puStack_200;
  pcStack_1f0 = (code *)puVar7;
  if ((long)puVar9 < 0) {
    recv_cb_cold_7();
LAB_001df663:
    recv_cb_cold_1();
LAB_001df670:
    recv_cb_cold_5();
LAB_001df675:
    recv_cb_cold_2();
LAB_001df682:
    recv_cb_cold_3();
LAB_001df68f:
    recv_cb_cold_4();
  }
  else {
    if (puVar9 != (undefined8 *)0x0) {
      uStack_1f8 = (ulong)in_R8 & 0xffffffff;
      puStack_200 = (undefined8 *)0x0;
      if (uStack_1f8 != 0) goto LAB_001df663;
      if (in_RCX == (undefined4 *)0x0) goto LAB_001df670;
      uStack_1f8 = 4;
      in_RCX = (undefined4 *)0x4;
      puStack_200 = puVar9;
      if (puVar9 != (undefined8 *)0x4) goto LAB_001df675;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      uStack_1f8 = (ulong)iVar3;
      puStack_200 = (undefined8 *)0x0;
      puVar7 = (undefined1 *)ppcVar10;
      if (uStack_1f8 != 0) goto LAB_001df682;
      iVar3 = uv_udp_recv_stop(ppcVar10);
      uStack_1f8 = (ulong)iVar3;
      puStack_200 = (undefined8 *)0x0;
      if (uStack_1f8 == 0) {
        iVar1 = uv_close(ppcVar10,close_cb);
        return iVar1;
      }
      goto LAB_001df68f;
    }
    iVar1 = 0;
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  recv_cb_cold_6();
  if (in_RCX == (undefined4 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)(in_RCX + 0x12),close_cb);
    return iVar1;
  }
  send_cb_cold_1();
  pcStack_2f8 = (code *)0x1df706;
  puStack_228 = puVar7;
  uVar2 = create_udp_socket();
  pcStack_2f8 = (code *)0x1df70d;
  uVar4 = create_udp_socket();
  uVar6 = (ulong)uVar4;
  pcStack_2f8 = (code *)0x1df714;
  uVar5 = uv_default_loop();
  pcStack_2f8 = (code *)0x1df721;
  iVar1 = uv_udp_init(uVar5,auStack_2e0);
  lStack_2e8 = (long)iVar1;
  lStack_2f0 = 0;
  if (lStack_2e8 == 0) {
    pcStack_2f8 = (code *)0x1df74b;
    iVar1 = uv_udp_open(auStack_2e0,uVar2);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = 0;
    if (lStack_2e8 != 0) goto LAB_001df83b;
    pcStack_2f8 = (code *)0x1df775;
    iVar1 = uv_udp_open(auStack_2e0,uVar4);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = -0x10;
    if (lStack_2e8 != -0x10) goto LAB_001df848;
    pcStack_2f8 = (code *)0x1df79a;
    iVar1 = close(uVar4);
    lStack_2e8 = (long)iVar1;
    lStack_2f0 = 0;
    if (lStack_2e8 != 0) goto LAB_001df855;
    pcStack_2f8 = (code *)0x1df7c4;
    uv_close(auStack_2e0,0);
    pcStack_2f8 = (code *)0x1df7c9;
    uVar5 = uv_default_loop();
    pcStack_2f8 = (code *)0x1df7d3;
    uv_run(uVar5,0);
    pcStack_2f8 = (code *)0x1df7d8;
    uVar6 = uv_default_loop();
    pcStack_2f8 = (code *)0x1df7ec;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_2f8 = (code *)0x1df7f6;
    uv_run(uVar6,0);
    lStack_2e8 = 0;
    pcStack_2f8 = (code *)0x1df804;
    uVar5 = uv_default_loop();
    pcStack_2f8 = (code *)0x1df80c;
    iVar1 = uv_loop_close(uVar5);
    lStack_2f0 = (long)iVar1;
    if (lStack_2e8 == lStack_2f0) {
      pcStack_2f8 = (code *)0x1df822;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2f8 = (code *)0x1df83b;
    run_test_udp_open_twice_cold_1();
LAB_001df83b:
    pcStack_2f8 = (code *)0x1df848;
    run_test_udp_open_twice_cold_2();
LAB_001df848:
    pcStack_2f8 = (code *)0x1df855;
    run_test_udp_open_twice_cold_3();
LAB_001df855:
    pcStack_2f8 = (code *)0x1df862;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_2f8 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_3e0 = (code *)0x1df88d;
  pcStack_2f8 = (code *)uVar6;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3c0);
  alStack_3b0[0] = (long)iVar1;
  lStack_3d0 = 0;
  if (alStack_3b0[0] == 0) {
    pcStack_3e0 = (code *)0x1df8b2;
    uVar4 = create_udp_socket();
    uVar6 = (ulong)uVar4;
    pcStack_3e0 = (code *)0x1df8c5;
    iVar1 = bind(uVar4,&sStack_3c0,0x10);
    alStack_3b0[0] = (long)iVar1;
    lStack_3d0 = 0;
    if (alStack_3b0[0] != 0) goto LAB_001dfa01;
    pcStack_3e0 = (code *)0x1df8ea;
    uVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1df8f7;
    iVar1 = uv_udp_init(uVar5,alStack_3b0);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dfa10;
    pcStack_3e0 = (code *)0x1df923;
    iVar1 = uv_udp_open(alStack_3b0,uVar4);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dfa1f;
    pcStack_3e0 = (code *)0x1df95b;
    iVar1 = uv_udp_recv_start(alStack_3b0,alloc_cb,recv_cb);
    lStack_3d0 = (long)iVar1;
    lStack_3c8 = 0;
    if (lStack_3d0 != 0) goto LAB_001dfa2e;
    pcStack_3e0 = (code *)0x1df987;
    uv_close(alStack_3b0,0);
    pcStack_3e0 = (code *)0x1df98c;
    uVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1df996;
    uv_run(uVar5,0);
    pcStack_3e0 = (code *)0x1df99b;
    uVar6 = uv_default_loop();
    pcStack_3e0 = (code *)0x1df9af;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_3e0 = (code *)0x1df9b9;
    uv_run(uVar6,0);
    lStack_3d0 = 0;
    pcStack_3e0 = (code *)0x1df9c7;
    uVar5 = uv_default_loop();
    pcStack_3e0 = (code *)0x1df9cf;
    iVar1 = uv_loop_close(uVar5);
    lStack_3c8 = (long)iVar1;
    if (lStack_3d0 == lStack_3c8) {
      pcStack_3e0 = (code *)0x1df9e7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3e0 = (code *)0x1dfa01;
    run_test_udp_open_bound_cold_1();
LAB_001dfa01:
    pcStack_3e0 = (code *)0x1dfa10;
    run_test_udp_open_bound_cold_2();
LAB_001dfa10:
    pcStack_3e0 = (code *)0x1dfa1f;
    run_test_udp_open_bound_cold_3();
LAB_001dfa1f:
    pcStack_3e0 = (code *)0x1dfa2e;
    run_test_udp_open_bound_cold_4();
LAB_001dfa2e:
    pcStack_3e0 = (code *)0x1dfa3d;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_3e0 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_588 = (code *)0x1dfa65;
  pcStack_3e0 = (code *)uVar6;
  auStack_570 = uv_buf_init("PING",4);
  pcStack_588 = (code *)0x1dfa85;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_560);
  alStack_498[0] = (long)iVar1;
  alStack_550[0] = 0;
  if (alStack_498[0] == 0) {
    pcStack_588 = (code *)0x1dfab0;
    uVar4 = create_udp_socket();
    uVar6 = (ulong)uVar4;
    pcStack_588 = (code *)0x1dfab7;
    uVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dfac7;
    iVar1 = uv_udp_init(uVar5,alStack_498);
    alStack_550[0] = (long)iVar1;
    lStack_580 = 0;
    if (alStack_550[0] != 0) goto LAB_001dfd05;
    pcStack_588 = (code *)0x1dfaf6;
    iVar1 = connect(uVar4,&sStack_560,0x10);
    alStack_550[0] = (long)iVar1;
    lStack_580 = 0;
    if (alStack_550[0] != 0) goto LAB_001dfd12;
    pcStack_588 = (code *)0x1dfb23;
    iVar1 = uv_udp_open(alStack_498,uVar4);
    alStack_550[0] = (long)iVar1;
    lStack_580 = 0;
    if (alStack_550[0] != 0) goto LAB_001dfd1f;
    pcStack_588 = (code *)0x1dfb46;
    uVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dfb53;
    iVar1 = uv_udp_init(uVar5,alStack_550);
    lStack_580 = (long)iVar1;
    lStack_578 = 0;
    if (lStack_580 != 0) goto LAB_001dfd2c;
    pcStack_588 = (code *)0x1dfb82;
    iVar1 = uv_udp_bind(alStack_550,&sStack_560,0);
    lStack_580 = (long)iVar1;
    lStack_578 = 0;
    if (lStack_580 != 0) goto LAB_001dfd39;
    pcStack_588 = (code *)0x1dfbb8;
    iVar1 = uv_udp_recv_start(alStack_550,alloc_cb,recv_cb);
    lStack_580 = (long)iVar1;
    lStack_578 = 0;
    if (lStack_580 != 0) goto LAB_001dfd46;
    pcStack_588 = (code *)0x1dfbfe;
    iVar1 = uv_udp_send(&send_req,alStack_498,auStack_570,1,0,send_cb);
    lStack_580 = (long)iVar1;
    lStack_578 = 0;
    if (lStack_580 != 0) goto LAB_001dfd53;
    pcStack_588 = (code *)0x1dfc21;
    uVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dfc2b;
    uv_run(uVar5,0);
    lStack_580 = 1;
    lStack_578 = (long)send_cb_called;
    if (lStack_578 != 1) goto LAB_001dfd60;
    lStack_580 = 2;
    lStack_578 = (long)close_cb_called;
    if (lStack_578 != 2) goto LAB_001dfd6d;
    lStack_580 = lStack_458;
    lStack_578 = 0;
    if (lStack_458 != 0) goto LAB_001dfd7a;
    pcStack_588 = (code *)0x1dfc9a;
    uVar6 = uv_default_loop();
    pcStack_588 = (code *)0x1dfcae;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_588 = (code *)0x1dfcb8;
    uv_run(uVar6,0);
    lStack_580 = 0;
    pcStack_588 = (code *)0x1dfcc5;
    uVar5 = uv_default_loop();
    pcStack_588 = (code *)0x1dfccd;
    iVar1 = uv_loop_close(uVar5);
    lStack_578 = (long)iVar1;
    if (lStack_580 == lStack_578) {
      pcStack_588 = (code *)0x1dfce8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_588 = (code *)0x1dfd05;
    run_test_udp_open_connect_cold_1();
LAB_001dfd05:
    pcStack_588 = (code *)0x1dfd12;
    run_test_udp_open_connect_cold_2();
LAB_001dfd12:
    pcStack_588 = (code *)0x1dfd1f;
    run_test_udp_open_connect_cold_3();
LAB_001dfd1f:
    pcStack_588 = (code *)0x1dfd2c;
    run_test_udp_open_connect_cold_4();
LAB_001dfd2c:
    pcStack_588 = (code *)0x1dfd39;
    run_test_udp_open_connect_cold_5();
LAB_001dfd39:
    pcStack_588 = (code *)0x1dfd46;
    run_test_udp_open_connect_cold_6();
LAB_001dfd46:
    pcStack_588 = (code *)0x1dfd53;
    run_test_udp_open_connect_cold_7();
LAB_001dfd53:
    pcStack_588 = (code *)0x1dfd60;
    run_test_udp_open_connect_cold_8();
LAB_001dfd60:
    pcStack_588 = (code *)0x1dfd6d;
    run_test_udp_open_connect_cold_9();
LAB_001dfd6d:
    pcStack_588 = (code *)0x1dfd7a;
    run_test_udp_open_connect_cold_10();
LAB_001dfd7a:
    pcStack_588 = (code *)0x1dfd87;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_588 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_590 = uVar6;
  pcStack_588 = (code *)(ulong)uVar2;
  auStack_810 = uv_buf_init("PING",4);
  uVar5 = uv_default_loop();
  uStack_7e4 = 0;
  uStack_7dc = 0;
  uStack_7d4 = 0;
  uStack_7cc = 0;
  uStack_7c4 = 0;
  uStack_7bc = 0;
  uStack_7b4 = 0;
  uStack_7ac = 0;
  uStack_7a4 = 0;
  uStack_7a0 = 0;
  uStack_79c = 0;
  uStack_798 = 0;
  auStack_7fe._0_2_ = 1;
  alStack_6d8[0] = 0x11;
  auStack_790[0] = 0x6c;
  auStack_7fe[2] = '/';
  auStack_7fe[3] = 't';
  auStack_7fe[4] = 'm';
  auStack_7fe[5] = 'p';
  auStack_7fe[6] = '/';
  auStack_7fe[7] = 'u';
  auStack_7fe[8] = 'v';
  auStack_7fe[9] = '-';
  auStack_7fe[10] = 't';
  auStack_7fe[0xb] = 'e';
  auStack_7fe[0xc] = 's';
  auStack_7fe[0xd] = 't';
  auStack_7fe[0xe] = '-';
  auStack_7fe[0xf] = 's';
  auStack_7fe[0x10] = 'o';
  auStack_7fe[0x11] = 'c';
  uStack_7ec = 0x6b;
  iVar1 = socket(1,1,0);
  alStack_6d8[0] = (long)iVar1;
  auStack_790[0] = 0;
  if (alStack_6d8[0] < 0) {
    auStack_790[0] = 0;
    run_test_udp_send_unix_cold_8();
LAB_001e0050:
    run_test_udp_send_unix_cold_2();
LAB_001e0065:
    run_test_udp_send_unix_cold_3();
LAB_001e007a:
    run_test_udp_send_unix_cold_4();
LAB_001e008c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar3 = bind(iVar1,(sockaddr *)auStack_7fe,0x6e);
    alStack_6d8[0] = (long)iVar3;
    auStack_790[0] = 0;
    if (alStack_6d8[0] != 0) goto LAB_001e0050;
    iVar3 = listen(iVar1,1);
    alStack_6d8[0] = (long)iVar3;
    auStack_790[0] = 0;
    if (alStack_6d8[0] != 0) goto LAB_001e0065;
    iVar3 = uv_udp_init(uVar5,auStack_790);
    alStack_6d8[0] = (long)iVar3;
    lStack_820 = 0;
    if (alStack_6d8[0] != 0) goto LAB_001e007a;
    iVar3 = uv_udp_open(auStack_790,iVar1);
    alStack_6d8[0] = (long)iVar3;
    lStack_820 = 0;
    if (alStack_6d8[0] != 0) goto LAB_001e008c;
    uv_run(uVar5,0);
    iVar3 = uv_udp_send(alStack_6d8,auStack_790,auStack_810,1,auStack_7fe,0);
    lStack_820 = (long)iVar3;
    lStack_818 = 0;
    if (lStack_820 == 0) {
      uv_close(auStack_790,0);
      uv_run(uVar5,0);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      lStack_820 = 0;
      iVar1 = uv_loop_close(uVar5);
      lStack_818 = (long)iVar1;
      if (lStack_820 == lStack_818) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001e00ad;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001e00ad:
  plVar11 = &lStack_820;
  run_test_udp_send_unix_cold_7();
  if (plVar11 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(plVar11,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_open(&client2, sock);
    ASSERT_EQ(r, UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  ASSERT_OK(client.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}